

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O2

string * tinyusdz::io::GetBaseFilename(string *__return_storage_ptr__,string *filepath)

{
  long lVar1;
  
  lVar1 = ::std::__cxx11::string::find_last_of((char *)filepath,0x31e535);
  if (lVar1 == -1) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filepath);
  }
  else {
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filepath);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetBaseFilename(const std::string &filepath) {
  auto idx = filepath.find_last_of("/\\");
  if (idx != std::string::npos) return filepath.substr(idx + 1);
  return filepath;
}